

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_decimal.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::DecimalMatcher::DecimalMatcher
          (DecimalMatcher *this,DecimalFormatSymbols *symbols,Grouper *grouper,
          parse_flags_t parseFlags)

{
  int c;
  UBool UVar1;
  int16_t iVar2;
  Key KVar3;
  UChar32 c_00;
  int32_t iVar4;
  UnicodeSet *pUVar5;
  UnicodeSet *pUVar6;
  undefined8 *puVar7;
  Key KVar8;
  UnicodeString *src;
  byte bVar9;
  long lVar10;
  UnicodeString *pUVar11;
  UnicodeString local_70;
  
  (this->super_NumberParseMatcher)._vptr_NumberParseMatcher =
       (_func_int **)&PTR__DecimalMatcher_003ea0d0;
  (this->groupingSeparator).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (this->groupingSeparator).fUnion.fStackFields.fLengthAndFlags = 2;
  pUVar11 = &this->decimalSeparator;
  (this->decimalSeparator).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->fLocalDecimalUniSet).super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr =
       (UnicodeSet *)0x0;
  (this->fLocalSeparatorSet).super_LocalPointerBase<const_icu_63::UnicodeSet>.ptr =
       (UnicodeSet *)0x0;
  (this->fLocalDigitStrings).super_LocalPointerBase<const_icu_63::UnicodeString>.ptr =
       (UnicodeString *)0x0;
  bVar9 = (byte)parseFlags;
  if ((parseFlags & 2U) == 0) {
    lVar10 = 8;
    UnicodeString::operator=(&this->groupingSeparator,(UnicodeString *)&symbols->field_0x48);
  }
  else {
    lVar10 = 0x288;
    UnicodeString::operator=(&this->groupingSeparator,(UnicodeString *)&symbols->field_0x448);
  }
  UnicodeString::operator=
            (pUVar11,(UnicodeString *)((long)&(symbols->super_UObject)._vptr_UObject + lVar10));
  pUVar5 = unisets::get(STRICT_ALL_SEPARATORS - (uint)((parseFlags & 4U) == 0));
  this->groupingUniSet = pUVar5;
  UnicodeString::UnicodeString(&local_70,pUVar11);
  KVar8 = (uint)parseFlags >> 1 & STRICT_IGNORABLES;
  KVar3 = KVar8 + COMMA;
  pUVar5 = (UnicodeSet *)(ulong)(uint)KVar3;
  KVar3 = unisets::chooseFrom(&local_70,KVar3,KVar8 | PERIOD);
  UnicodeString::~UnicodeString(&local_70);
  if (KVar3 < EMPTY) {
    if ((ushort)(this->decimalSeparator).fUnion.fStackFields.fLengthAndFlags < 0x20) {
      pUVar6 = unisets::get(EMPTY);
      this->decimalUniSet = pUVar6;
    }
    else {
      pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar5);
      if (pUVar5 != (UnicodeSet *)0x0) {
        UnicodeSet::UnicodeSet(pUVar5);
      }
      c_00 = UnicodeString::char32At(pUVar11,0);
      UnicodeSet::add(pUVar5,c_00);
      UnicodeSet::freeze(pUVar5);
      this->decimalUniSet = pUVar5;
      LocalPointer<const_icu_63::UnicodeSet>::adoptInstead(&this->fLocalDecimalUniSet,pUVar5);
    }
    pUVar5 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar5);
    UnicodeSet::UnicodeSet(pUVar5);
    UnicodeSet::addAll(pUVar5,this->groupingUniSet);
    UnicodeSet::addAll(pUVar5,this->decimalUniSet);
    UnicodeSet::freeze(pUVar5);
    this->separatorSet = pUVar5;
    LocalPointer<const_icu_63::UnicodeSet>::adoptInstead(&this->fLocalSeparatorSet,pUVar5);
    pUVar6 = (UnicodeSet *)0x0;
  }
  else {
    pUVar6 = unisets::get(KVar3);
    this->decimalUniSet = pUVar6;
    this->separatorSet = this->groupingUniSet;
    pUVar6 = unisets::get((uint)((parseFlags & 4U) == 0) + DIGITS_OR_ALL_SEPARATORS);
  }
  this->leadSet = pUVar6;
  c = symbols->fCodePointZero;
  if (c != -1) {
    UVar1 = u_isdigit_63(c);
    if (UVar1 != '\0') {
      pUVar5 = (UnicodeSet *)0xa;
      iVar4 = u_digit_63(c,'\n');
      if (iVar4 == 0) goto LAB_0028d272;
    }
  }
  puVar7 = (undefined8 *)UMemory::operator_new__((UMemory *)0x288,(size_t)pUVar5);
  if (puVar7 == (undefined8 *)0x0) {
    pUVar11 = (UnicodeString *)0x0;
  }
  else {
    *puVar7 = 10;
    lVar10 = 0x10;
    do {
      *(undefined ***)((long)puVar7 + lVar10 + -8) = &PTR__UnicodeString_003f5be0;
      *(undefined2 *)((long)puVar7 + lVar10) = 2;
      lVar10 = lVar10 + 0x40;
    } while (lVar10 != 0x290);
    pUVar11 = (UnicodeString *)(puVar7 + 1);
  }
  LocalArray<const_icu_63::UnicodeString>::adoptInstead(&this->fLocalDigitStrings,pUVar11);
  lVar10 = 0;
  do {
    src = (UnicodeString *)(&symbols->field_0x448 + lVar10);
    if (lVar10 == 0) {
      src = (UnicodeString *)&symbols->field_0x108;
    }
    UnicodeString::operator=
              ((UnicodeString *)
               ((long)&(pUVar11->super_Replaceable).super_UObject._vptr_UObject + lVar10),src);
    lVar10 = lVar10 + 0x40;
  } while (lVar10 != 0x280);
LAB_0028d272:
  this->requireGroupingMatch = (bool)(bVar9 >> 3 & 1);
  this->groupingDisabled = (bool)(bVar9 >> 5 & 1);
  this->integerOnly = (bool)(bVar9 >> 4 & 1);
  iVar2 = icu_63::number::impl::Grouper::getPrimary(grouper);
  this->grouping1 = iVar2;
  iVar2 = icu_63::number::impl::Grouper::getSecondary(grouper);
  this->grouping2 = iVar2;
  return;
}

Assistant:

DecimalMatcher::DecimalMatcher(const DecimalFormatSymbols& symbols, const Grouper& grouper,
                               parse_flags_t parseFlags) {
    if (0 != (parseFlags & PARSE_FLAG_MONETARY_SEPARATORS)) {
        groupingSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kMonetaryGroupingSeparatorSymbol);
        decimalSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kMonetarySeparatorSymbol);
    } else {
        groupingSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
        decimalSeparator = symbols.getConstSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol);
    }
    bool strictSeparators = 0 != (parseFlags & PARSE_FLAG_STRICT_SEPARATORS);
    unisets::Key groupingKey = strictSeparators ? unisets::STRICT_ALL_SEPARATORS
                                                : unisets::ALL_SEPARATORS;

    // Attempt to find separators in the static cache

    groupingUniSet = unisets::get(groupingKey);
    unisets::Key decimalKey = unisets::chooseFrom(
            decimalSeparator,
            strictSeparators ? unisets::STRICT_COMMA : unisets::COMMA,
            strictSeparators ? unisets::STRICT_PERIOD : unisets::PERIOD);
    if (decimalKey >= 0) {
        decimalUniSet = unisets::get(decimalKey);
    } else if (!decimalSeparator.isEmpty()) {
        auto* set = new UnicodeSet();
        set->add(decimalSeparator.char32At(0));
        set->freeze();
        decimalUniSet = set;
        fLocalDecimalUniSet.adoptInstead(set);
    } else {
        decimalUniSet = unisets::get(unisets::EMPTY);
    }

    if (groupingKey >= 0 && decimalKey >= 0) {
        // Everything is available in the static cache
        separatorSet = groupingUniSet;
        leadSet = unisets::get(
                strictSeparators ? unisets::DIGITS_OR_ALL_SEPARATORS
                                 : unisets::DIGITS_OR_STRICT_ALL_SEPARATORS);
    } else {
        auto* set = new UnicodeSet();
        set->addAll(*groupingUniSet);
        set->addAll(*decimalUniSet);
        set->freeze();
        separatorSet = set;
        fLocalSeparatorSet.adoptInstead(set);
        leadSet = nullptr;
    }

    UChar32 cpZero = symbols.getCodePointZero();
    if (cpZero == -1 || !u_isdigit(cpZero) || u_digit(cpZero, 10) != 0) {
        // Uncommon case: okay to allocate.
        auto digitStrings = new UnicodeString[10];
        fLocalDigitStrings.adoptInstead(digitStrings);
        for (int32_t i = 0; i <= 9; i++) {
            digitStrings[i] = symbols.getConstDigitSymbol(i);
        }
    }

    requireGroupingMatch = 0 != (parseFlags & PARSE_FLAG_STRICT_GROUPING_SIZE);
    groupingDisabled = 0 != (parseFlags & PARSE_FLAG_GROUPING_DISABLED);
    integerOnly = 0 != (parseFlags & PARSE_FLAG_INTEGER_ONLY);
    grouping1 = grouper.getPrimary();
    grouping2 = grouper.getSecondary();

    // Fraction grouping parsing is disabled for now but could be enabled later.
    // See http://bugs.icu-project.org/trac/ticket/10794
    // fractionGrouping = 0 != (parseFlags & PARSE_FLAG_FRACTION_GROUPING_ENABLED);
}